

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testUleb(void)

{
  ulong value0;
  undefined1 auVar1 [16];
  char *pcVar2;
  C *pCVar3;
  long lVar4;
  char buffer [16];
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_68;
  char local_48 [24];
  
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 8) {
    value0 = *(ulong *)((long)testUleb::values + lVar4);
    pcVar2 = axl::enc::encodeUleb128<unsigned_long>(local_48,value0);
    axl::enc::HexEncoding::encode((String *)&local_68,local_48,(long)pcVar2 - (long)local_48,0);
    pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    if (local_68.m_length != 0) {
      pCVar3 = local_68.m_p;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = value0;
    printf("0x%llx (%d us, %d bps) -> %s\n",value0,value0,
           SUB168((ZEXT816(0) << 0x40 | ZEXT816(10000000)) / auVar1,0),pCVar3);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_68);
  }
  return;
}

Assistant:

void testUleb() {
	static uint64_t values[] = {
		0x13AF12,
		0x00270F,
	};

	char buffer[16];

	for (size_t i = 0; i < countof(values); i++) {
		uint64_t x = values[i];
		char* p = enc::encodeUleb128(buffer, x);
		printf("0x%llx (%d us, %d bps) -> %s\n", x, x, 1000000ULL * 10 / x, enc::HexEncoding::encode(buffer, p - buffer).sz());
	}
}